

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_fast.c
# Opt level: O2

uint32_t lzma_crc32(uint8_t *buf,size_t size,uint32_t crc)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  long lVar5;
  
  uVar2 = ~crc;
  if (8 < size) {
    for (lVar5 = 0; ((int)buf + (int)lVar5 & 7U) != 0; lVar5 = lVar5 + 1) {
      uVar2 = uVar2 >> 8 ^ lzma_crc32_table[0][uVar2 & 0xff ^ (uint)buf[lVar5]];
    }
    buf = buf + (-(int)buf & 7);
    puVar4 = (uint *)((size - lVar5 & 0xfffffffffffffff8) + (long)buf);
    for (; buf < puVar4; buf = (uint8_t *)((long)buf + 8)) {
      uVar2 = uVar2 ^ *(uint *)buf;
      uVar1 = *(uint *)((long)buf + 4);
      uVar2 = lzma_crc32_table[6][uVar2 >> 8 & 0xff] ^ lzma_crc32_table[7][uVar2 & 0xff] ^
              *(uint *)((long)lzma_crc32_table[5] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
              lzma_crc32_table[4][uVar2 >> 0x18] ^ lzma_crc32_table[3][uVar1 & 0xff] ^
              lzma_crc32_table[2][uVar1 >> 8 & 0xff] ^
              *(uint *)((long)lzma_crc32_table[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
              lzma_crc32_table[0][uVar1 >> 0x18];
    }
    size = (size_t)((uint)(size - lVar5) & 7);
  }
  for (sVar3 = 0; size != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = uVar2 >> 8 ^ lzma_crc32_table[0][uVar2 & 0xff ^ (uint)*(byte *)((long)buf + sVar3)];
  }
  return ~uVar2;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_crc32(const uint8_t *buf, size_t size, uint32_t crc)
{
	crc = ~crc;

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	if (size > 8) {
		const uint8_t * limit;

		// Fix the alignment, if needed. The if statement above
		// ensures that this won't read past the end of buf[].
		while ((uintptr_t)(buf) & 7) {
			crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);
			--size;
		}

		// Calculate the position where to stop.
		limit = buf + (size & ~(size_t)(7));

		// Calculate how many bytes must be calculated separately
		// before returning the result.
		size &= (size_t)(7);

		// Calculate the CRC32 using the slice-by-eight algorithm.
		while (buf < limit) {
			uint32_t tmp;

			crc ^= *(const uint32_t *)(buf);
			buf += 4;

			crc = lzma_crc32_table[7][A(crc)]
			    ^ lzma_crc32_table[6][B(crc)]
			    ^ lzma_crc32_table[5][C(crc)]
			    ^ lzma_crc32_table[4][D(crc)];

			tmp = *(const uint32_t *)(buf);
			buf += 4;

			// At least with some compilers, it is critical for
			// performance, that the crc variable is XORed
			// between the two table-lookup pairs.
			crc = lzma_crc32_table[3][A(tmp)]
			    ^ lzma_crc32_table[2][B(tmp)]
			    ^ crc
			    ^ lzma_crc32_table[1][C(tmp)]
			    ^ lzma_crc32_table[0][D(tmp)];
		}
	}

	while (size-- != 0)
		crc = lzma_crc32_table[0][*buf++ ^ A(crc)] ^ S8(crc);

#ifdef WORDS_BIGENDIAN
	crc = bswap32(crc);
#endif

	return ~crc;
}